

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O3

void __thiscall JsonTest::TestResult::TestResult(TestResult *this)

{
  this->predicateId_ = 1;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->failures_).super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>::_M_initialize_map
            (&(this->failures_).
              super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>,0);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->lastUsedPredicateId_ = 0;
  this->messageTarget_ = (Failure *)0x0;
  (this->rootPredicateNode_).id_ = 0;
  (this->rootPredicateNode_).next_ = (PredicateContext *)0x0;
  this->predicateStackTail_ = &this->rootPredicateNode_;
  return;
}

Assistant:

TestResult::TestResult()
    : predicateId_(1), lastUsedPredicateId_(0), messageTarget_(0) {
  // The root predicate has id 0
  rootPredicateNode_.id_ = 0;
  rootPredicateNode_.next_ = 0;
  predicateStackTail_ = &rootPredicateNode_;
}